

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTest.hpp
# Opt level: O3

void __thiscall
Qentem::QTest::IsEqual<Qentem::StringStream<char>,char[32]>
          (QTest *this,StringStream<char> *left,char (*right) [32],unsigned_long line)

{
  long lVar1;
  SizeT SVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if ((this->error_ != true) || (this->continue_on_error_ == true)) {
    if ((*right)[0] == '\0') {
      SVar2 = left->length_;
joined_r0x0013ad3d:
      if (SVar2 != 0) goto LAB_0013ad3f;
    }
    else {
      uVar3 = 0;
      do {
        lVar1 = uVar3 + 1;
        uVar3 = uVar3 + 1;
      } while ((*right)[lVar1] != '\0');
      if (left->length_ != (SizeT)uVar3) {
LAB_0013ad3f:
        this->error_ = true;
        PrintErrorMessage<Qentem::StringStream<char>,char[32]>(this,false,left,right,line);
        return;
      }
      if ((SizeT)uVar3 != 0) {
        uVar4 = uVar3 & 0xffffffff;
        uVar5 = 0;
        do {
          SVar2 = (SizeT)uVar3;
          if (left->storage_[uVar5] != (*right)[uVar5]) goto joined_r0x0013ad3d;
          uVar5 = uVar5 + 1;
          uVar3 = (ulong)(SVar2 - 1);
        } while (uVar4 != uVar5);
      }
    }
  }
  return;
}

Assistant:

QENTEM_NOINLINE void IsEqual(const Value1_T &left, const Value2_T &right, unsigned long line) {
        if ((!error_ || continue_on_error_) && (left != right)) {
            error_ = true;
            QTest::PrintErrorMessage(false, left, right, line);
        }
    }